

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O3

int ffikls(fitsfile *fptr,char *keyname,char *value,char *comm,int *status)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  char *pcVar6;
  size_t sVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  int tstatus;
  char valstring [71];
  char card [81];
  char tstring [71];
  char tmpkeyname [81];
  int local_19c;
  char *local_198;
  char *local_190;
  char local_188 [80];
  char local_138 [8];
  undefined2 local_130;
  char local_d8 [79];
  char local_89;
  char local_88 [80];
  undefined1 local_38;
  
  local_19c = -1;
  iVar13 = *status;
  if (iVar13 < 1) {
    sVar5 = strlen(value);
    pcVar6 = strchr(value,0x27);
    local_190 = value;
    if (pcVar6 == (char *)0x0) {
      iVar13 = 0;
    }
    else {
      iVar13 = 0;
      do {
        iVar13 = iVar13 + 1;
        pcVar6 = strchr(pcVar6 + 1,0x27);
      } while (pcVar6 != (char *)0x0);
    }
    local_198 = keyname;
    strncpy(local_88,keyname,0x50);
    local_38 = 0;
    pcVar6 = &local_89;
    do {
      pcVar1 = pcVar6 + 1;
      pcVar6 = pcVar6 + 1;
    } while (*pcVar1 == ' ');
    sVar7 = strlen(pcVar6);
    if (((int)sVar7 < 9) && (iVar4 = fftkey(pcVar6,&local_19c), iVar4 < 1)) {
      iVar4 = 0x44 - iVar13;
    }
    else {
      iVar4 = 0x4b - ((int)sVar7 + iVar13);
    }
    if (0 < (int)sVar5) {
      iVar12 = 0;
      bVar3 = true;
      do {
        if (0x46 < iVar4) {
          ffpmsg("longstr keyword value is too long (ffikls)");
          *status = 0xcf;
          return 0xcf;
        }
        strncpy(local_d8,local_190 + iVar12,(long)iVar4);
        local_d8[iVar4] = '\0';
        ffs2c(local_d8,local_188,status);
        iVar10 = (int)sVar5;
        if (iVar4 < iVar10) {
          sVar5 = strlen(local_188);
          iVar4 = iVar4 + -1;
          lVar8 = sVar5 << 0x20;
          lVar9 = lVar8 + -0x200000000 >> 0x20;
          if (local_188[lVar9] == '\'') {
            local_188[lVar8 + -0x300000000 >> 0x20] = '&';
            local_188[lVar8 + -0x100000000 >> 0x20] = '\0';
          }
          else {
            local_188[lVar9] = '&';
          }
        }
        if (bVar3) {
          ffmkky(local_198,local_188,comm,local_138,status);
        }
        else {
          ffmkky("CONTINUE",local_188,comm,local_138,status);
          local_130 = 0x2020;
        }
        ffikey(fptr,local_138,status);
        iVar12 = iVar12 + iVar4;
        bVar3 = false;
        uVar11 = iVar10 - iVar4;
        sVar5 = (size_t)uVar11;
        bVar2 = iVar4 <= iVar10;
        iVar4 = 0x44 - iVar13;
      } while (uVar11 != 0 && bVar2);
    }
    iVar13 = *status;
  }
  return iVar13;
}

Assistant:

int ffikls( fitsfile *fptr,           /* I - FITS file pointer        */
            const char *keyname,      /* I - name of keyword to write */
            const char *value,        /* I - keyword value            */
            const char *comm,         /* I - keyword comment          */
            int  *status)             /* IO - error status            */
/*
  Insert a long string keyword.  This routine supports the
  HEASARC long string convention and can insert arbitrarily long string
  keyword values.  The value is continued over multiple keywords that
  have the name COMTINUE without an equal sign in column 9 of the card.
  This routine also supports simple string keywords which are less than
  69 characters in length.
*/
{
    char valstring[FLEN_VALUE];
    char card[FLEN_CARD], tmpkeyname[FLEN_CARD];
    char tstring[FLEN_VALUE], *cptr;
    int next, remain, vlen, nquote, nchar, namelen, contin, tstatus = -1;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /*  construct the new keyword, and insert into header */
    remain = strlen(value);    /* number of characters to write out */
    next = 0;                  /* pointer to next character to write */
    
    /* count the number of single quote characters in the string */
    nquote = 0;
    cptr = strchr(value, '\'');   /* search for quote character */

    while (cptr)  /* search for quote character */
    {
        nquote++;            /*  increment no. of quote characters  */
        cptr++;              /*  increment pointer to next character */
        cptr = strchr(cptr, '\'');  /* search for another quote char */
    }


    strncpy(tmpkeyname, keyname, 80);
    tmpkeyname[80] = '\0';
    
    cptr = tmpkeyname;
    while(*cptr == ' ')   /* skip over leading spaces in name */
        cptr++;

    /* determine the number of characters that will fit on the line */
    /* Note: each quote character is expanded to 2 quotes */

    namelen = strlen(cptr);
    if (namelen <= 8 && (fftkey(cptr, &tstatus) <= 0) )
    {
        /* This a normal 8-character FITS keyword */
        nchar = 68 - nquote; /*  max of 68 chars fit in a FITS string value */
    }
    else
    {
	nchar = 80 - nquote - namelen - 5;
    }

    contin = 0;
    while (remain > 0)
    {
        if (nchar > FLEN_VALUE-1)
        {
           ffpmsg("longstr keyword value is too long (ffikls)");
           return (*status=BAD_KEYCHAR);
        }
        strncpy(tstring, &value[next], nchar); /* copy string to temp buff */
        tstring[nchar] = '\0';
        ffs2c(tstring, valstring, status);  /* put quotes around the string */

        if (remain > nchar)   /* if string is continued, put & as last char */
        {
            vlen = strlen(valstring);
            nchar -= 1;        /* outputting one less character now */

            if (valstring[vlen-2] != '\'')
                valstring[vlen-2] = '&';  /*  over write last char with &  */
            else
            { /* last char was a pair of single quotes, so over write both */
                valstring[vlen-3] = '&';
                valstring[vlen-1] = '\0';
            }
        }

        if (contin)           /* This is a CONTINUEd keyword */
        {
           ffmkky("CONTINUE", valstring, comm, card, status); /* make keyword */
           strncpy(&card[8], "   ",  2);  /* overwrite the '=' */
        }
        else
        {
           ffmkky(keyname, valstring, comm, card, status);  /* make keyword */
        }

        ffikey(fptr, card, status);  /* insert the keyword */
       
        contin = 1;
        remain -= nchar;
        next  += nchar;
        nchar = 68 - nquote;
    }
    return(*status);
}